

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-ws.cpp
# Opt level: O3

void __thiscall ImGuiWS::Impl::Events::push(Events *this,Event *event)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar1 == 0) {
    std::deque<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_>::emplace_back<ImGuiWS::Event>
              (&this->data,event);
    std::condition_variable::notify_one();
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void push(Event && event) {
            std::lock_guard<std::mutex> lock(mutex);
            data.push_back(std::move(event));
            cv.notify_one();
        }